

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O1

void RigidBodyDynamics::SolveLinearSystem(MatrixNd *A,VectorNd *b,VectorNd *x,LinearSolver ls)

{
  RBDLSizeMismatchError *this;
  ostream *poVar1;
  RBDLError *this_00;
  ActualDstType actualDst;
  ostringstream errormsg;
  assign_op<double,_double> local_1e9;
  SrcXprType local_1e8;
  string local_1d8;
  string local_1b8;
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_198 [2];
  
  if (((A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows ==
       (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) &&
     ((A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols ==
      (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)) {
    local_1e8.m_rhs = b;
    if (ls == LinearSolverHouseholderQR) {
      Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_198,
                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)A);
      local_1e8.m_dec = local_198;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(x,(SrcXprType *)&local_1e8,&local_1e9);
    }
    else if (ls == LinearSolverColPivHouseholderQR) {
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_198,
                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)A);
      local_1e8.m_dec = local_198;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(x,&local_1e8,&local_1e9);
      free(local_198[0].m_colNormsDirect.
           super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data);
      free(local_198[0].m_colNormsUpdated.
           super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data);
      free(local_198[0].m_temp.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
           m_storage.m_data);
      free(local_198[0].m_colsTranspositions.
           super_PlainObjectBase<Eigen::Matrix<long,_1,__1,_1,_1,__1>_>.m_storage.m_data);
    }
    else {
      if (ls != LinearSolverPartialPivLU) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,"Error: Invalid linear solver: ",0x1e);
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_198,ls);
        std::endl<char,std::char_traits<char>>(poVar1);
        this_00 = (RBDLError *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        Errors::RBDLError::RBDLError(this_00,&local_1b8);
        __cxa_throw(this_00,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
      }
      Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_198,
                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)A);
      local_1e8.m_dec = local_198;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(x,(SrcXprType *)&local_1e8,&local_1e9);
    }
    free(local_198[0].m_colsPermutation.m_indices.
         super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(local_198[0].m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    free(local_198[0].m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_data);
    return;
  }
  this = (RBDLSizeMismatchError *)__cxa_allocate_exception(0x28);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Mismatching sizes.\n","");
  Errors::RBDLSizeMismatchError::RBDLSizeMismatchError(this,&local_1d8);
  __cxa_throw(this,&Errors::RBDLSizeMismatchError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

void SolveLinearSystem (
  const MatrixNd& A,
  const VectorNd& b,
  VectorNd& x,
  LinearSolver ls
)
{
  if(A.rows() != b.size() || A.cols() != x.size()) {
    throw Errors::RBDLSizeMismatchError("Mismatching sizes.\n");
  }

#ifdef RBDL_USE_CASADI_MATH
  auto linsol = casadi::Linsol("linear_solver", "symbolicqr", A.sparsity());
  x = linsol.solve(A, b);
#else
  // Solve the system A*x = b.
  switch (ls) {
  case (LinearSolverPartialPivLU) :
    x = A.partialPivLu().solve(b);
    break;
  case (LinearSolverColPivHouseholderQR) :
    x = A.colPivHouseholderQr().solve(b);
    break;
  case (LinearSolverHouseholderQR) :
    x = A.householderQr().solve(b);
    break;
  default:
    std::ostringstream errormsg;
    errormsg << "Error: Invalid linear solver: " << ls << std::endl;
    throw Errors::RBDLError(errormsg.str());
    break;
  }
#endif
}